

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O1

aom_codec_err_t
decoder_decode(aom_codec_alg_priv_t *ctx,uint8_t *data,size_t data_sz,void *user_priv)

{
  AVxWorker *pAVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  aom_codec_alg_priv_t *paVar5;
  uint8_t *puVar6;
  int iVar7;
  aom_codec_err_t aVar8;
  aom_codec_err_t aVar9;
  AVxWorkerInterface *pAVar10;
  char *pcVar11;
  uint8_t *puVar12;
  bool bVar13;
  uint64_t temporal_unit_size;
  size_t length_of_size;
  undefined8 local_68;
  ulong local_60;
  uint8_t *local_58;
  aom_codec_alg_priv_t *local_50;
  aom_codec_stream_info_t *local_48;
  EXTERNAL_REFERENCES *local_40;
  void *local_38;
  
  local_38 = user_priv;
  release_pending_output_frames(ctx);
  if (data == (uint8_t *)0x0 && data_sz == 0) {
    ctx->flushed = 1;
    aVar8 = AOM_CODEC_OK;
  }
  else {
    aVar8 = AOM_CODEC_INVALID_PARAM;
    if ((data != (uint8_t *)0x0 && data_sz != 0) &&
       ((ctx->flushed = 0, ctx->frame_worker != (AVxWorker *)0x0 ||
        (aVar8 = init_decoder(ctx), aVar8 == AOM_CODEC_OK)))) {
      puVar12 = data + data_sz;
      if (ctx->is_annexb != 0) {
        iVar7 = aom_uleb_decode(data,data_sz,&local_68,&local_60);
        if (iVar7 == 0) {
          data = data + local_60;
          uVar4 = CONCAT44(local_68._4_4_,(int)local_68);
          bVar13 = uVar4 <= data_sz - local_60;
          if (uVar4 <= data_sz - local_60) {
            puVar12 = data + uVar4;
          }
        }
        else {
          bVar13 = false;
        }
        if (!bVar13) {
          return AOM_CODEC_CORRUPT_FRAME;
        }
      }
      local_48 = &ctx->si;
      local_40 = &ctx->ext_refs;
      aVar9 = AOM_CODEC_OK;
      aVar8 = AOM_CODEC_CORRUPT_FRAME;
      local_58 = puVar12;
      local_50 = ctx;
      do {
        if (puVar12 <= data) {
          return aVar9;
        }
        if (ctx->is_annexb == 0) {
          local_60 = (long)puVar12 - (long)data;
LAB_00166c1e:
          uVar4 = local_60;
          pAVar10 = aom_get_worker_interface();
          paVar5 = local_50;
          if ((local_50->si).h == 0) {
            local_68._0_4_ = 0;
            (local_50->si).is_annexb = local_50->is_annexb;
            aVar9 = decoder_peek_si_internal(data,uVar4,local_48,(int *)&local_68);
            if (aVar9 == AOM_CODEC_OK) {
              bVar13 = (int)local_68 != 0 || (paVar5->si).is_kf != 0;
              aVar9 = AOM_CODEC_ERROR;
            }
            else {
              bVar13 = false;
            }
            ctx = local_50;
            if (bVar13) goto LAB_00166c94;
          }
          else {
LAB_00166c94:
            ctx = local_50;
            pAVar1 = local_50->frame_worker;
            plVar2 = (long *)pAVar1->data1;
            plVar2[1] = (long)data;
            plVar2[3] = uVar4;
            plVar2[4] = (long)local_38;
            *(undefined4 *)(plVar2 + 5) = 1;
            lVar3 = *plVar2;
            *(uint *)(lVar3 + 0x9e44) = local_50->tile_mode;
            *(undefined8 *)(lVar3 + 0x58da0) = *(undefined8 *)&local_50->decode_tile_row;
            *(undefined8 *)(lVar3 + 0x58df0) = *(undefined8 *)&local_50->ext_tile_debug;
            memcpy((void *)(lVar3 + 0x58df8),local_40,0x6808);
            *(uint *)(*plVar2 + 0x5f72c) = ctx->is_annexb;
            pAVar1->had_error = 0;
            (*pAVar10->execute)(pAVar1);
            lVar3 = *plVar2;
            data = (uint8_t *)plVar2[2];
            if (pAVar1->had_error == 0) {
              aVar9 = AOM_CODEC_OK;
              if (((ctx->need_resync == 1) && (*(int *)(lVar3 + 0x58d90) == 0)) &&
                 ((*(byte *)(lVar3 + 0x3b60) & 0xfd) == 0)) {
                ctx->need_resync = 0;
              }
            }
            else {
              aVar9 = *(aom_codec_err_t *)(lVar3 + 0x5ff08);
              if (aVar9 != AOM_CODEC_OK) {
                pcVar11 = (char *)0x0;
                if (*(int *)(lVar3 + 0x5ff0c) != 0) {
                  pcVar11 = (char *)(lVar3 + 0x5ff10);
                }
                (ctx->base).err_detail = pcVar11;
              }
            }
          }
          puVar6 = data;
          puVar12 = local_58;
          if (aVar9 == AOM_CODEC_OK) {
            do {
              data = puVar6;
              bVar13 = true;
              if (local_58 <= data) goto LAB_00166dc1;
              puVar6 = data + 1;
            } while (*data == '\0');
            data = data + (*data == '\0');
          }
          else {
            bVar13 = false;
            aVar8 = aVar9;
          }
        }
        else {
          iVar7 = aom_uleb_decode(data,(long)puVar12 - (long)data,&local_60,&local_68);
          if (iVar7 == 0) {
            data = data + CONCAT44(local_68._4_4_,(int)local_68);
            bVar13 = local_60 <= (ulong)((long)puVar12 - (long)data);
            if ((ulong)((long)puVar12 - (long)data) < local_60) {
              aVar8 = AOM_CODEC_CORRUPT_FRAME;
            }
          }
          else {
            aVar8 = AOM_CODEC_CORRUPT_FRAME;
            bVar13 = false;
          }
          if (bVar13) goto LAB_00166c1e;
          bVar13 = false;
        }
LAB_00166dc1:
      } while (bVar13);
    }
  }
  return aVar8;
}

Assistant:

static aom_codec_err_t decoder_decode(aom_codec_alg_priv_t *ctx,
                                      const uint8_t *data, size_t data_sz,
                                      void *user_priv) {
  aom_codec_err_t res = AOM_CODEC_OK;

#if CONFIG_INSPECTION
  if (user_priv != 0) {
    return decoder_inspect(ctx, data, data_sz, user_priv);
  }
#endif

  release_pending_output_frames(ctx);

  /* Sanity checks */
  /* NULL data ptr allowed if data_sz is 0 too */
  if (data == NULL && data_sz == 0) {
    ctx->flushed = 1;
    return AOM_CODEC_OK;
  }
  if (data == NULL || data_sz == 0) return AOM_CODEC_INVALID_PARAM;

  // Reset flushed when receiving a valid frame.
  ctx->flushed = 0;

  // Initialize the decoder worker on the first frame.
  if (ctx->frame_worker == NULL) {
    res = init_decoder(ctx);
    if (res != AOM_CODEC_OK) return res;
  }

  const uint8_t *data_start = data;
  const uint8_t *data_end = data + data_sz;

  if (ctx->is_annexb) {
    // read the size of this temporal unit
    size_t length_of_size;
    uint64_t temporal_unit_size;
    if (aom_uleb_decode(data_start, data_sz, &temporal_unit_size,
                        &length_of_size) != 0) {
      return AOM_CODEC_CORRUPT_FRAME;
    }
    data_start += length_of_size;
    if (temporal_unit_size > (size_t)(data_end - data_start))
      return AOM_CODEC_CORRUPT_FRAME;
    data_end = data_start + temporal_unit_size;
  }

  // Decode in serial mode.
  while (data_start < data_end) {
    uint64_t frame_size;
    if (ctx->is_annexb) {
      // read the size of this frame unit
      size_t length_of_size;
      if (aom_uleb_decode(data_start, (size_t)(data_end - data_start),
                          &frame_size, &length_of_size) != 0) {
        return AOM_CODEC_CORRUPT_FRAME;
      }
      data_start += length_of_size;
      if (frame_size > (size_t)(data_end - data_start))
        return AOM_CODEC_CORRUPT_FRAME;
    } else {
      frame_size = (uint64_t)(data_end - data_start);
    }

    res = decode_one(ctx, &data_start, (size_t)frame_size, user_priv);
    if (res != AOM_CODEC_OK) return res;

    // Allow extra zero bytes after the frame end
    while (data_start < data_end) {
      const uint8_t marker = data_start[0];
      if (marker) break;
      ++data_start;
    }
  }

  return res;
}